

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::getChrm(float *m,float *whitepoint,uint use_icc,LodePNGICC *icc,LodePNGInfo *info)

{
  undefined4 in_EAX;
  uint uVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float wX;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar10;
  float fVar11;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar12;
  float fVar13;
  float local_9c;
  float white [3];
  float local_78 [9];
  float blue [3];
  float green [3];
  float red [3];
  
  if (use_icc == 0) {
    if ((info->chrm_defined == 0) || (info->srgb_defined != 0)) {
      for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 4) {
        *(undefined4 *)((long)m + lVar3) = *(undefined4 *)((long)getChrm::srgb + lVar3);
      }
      whitepoint[0] = 0.9504559;
      whitepoint[1] = 1.0;
      whitepoint[2] = 1.0890578;
      return 0;
    }
    auVar8._0_4_ = ((float)(info->chrm_white_y >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(info->chrm_white_y & 0xffff | 0x4b000000);
    auVar8._4_4_ = ((float)(info->chrm_red_y >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(info->chrm_red_y & 0xffff | 0x4b000000);
    auVar8._8_4_ = ((float)(info->chrm_green_y >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(info->chrm_green_y & 0xffff | 0x4b000000);
    auVar8._12_4_ =
         ((float)(info->chrm_blue_y >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(info->chrm_blue_y & 0xffff | 0x4b000000);
    auVar9 = divps(auVar8,_DAT_001278c0);
    local_9c = auVar9._0_4_;
    fVar10 = auVar9._4_4_;
    fVar11 = auVar9._8_4_;
    fVar12 = auVar9._12_4_;
    auVar9._4_4_ = -(uint)(fVar10 == 0.0);
    auVar9._0_4_ = -(uint)(local_9c == 0.0);
    auVar9._8_4_ = -(uint)(fVar11 == 0.0);
    auVar9._12_4_ = -(uint)(fVar12 == 0.0);
    iVar2 = movmskps(in_EAX,auVar9);
    if (iVar2 != 0) {
      return 1;
    }
    fVar4 = (float)info->chrm_white_x / 100000.0;
    fVar13 = (float)info->chrm_blue_x / 100000.0;
    fVar7 = (float)info->chrm_green_x / 100000.0;
    fVar6 = (float)info->chrm_red_x / 100000.0;
    wX = fVar4 / local_9c;
    local_9c = ((1.0 - fVar4) - local_9c) / local_9c;
    uVar1 = getChrmMatrixXYZ(m,wX,1.0,local_9c,fVar6 / fVar10,1.0,((1.0 - fVar6) - fVar10) / fVar10,
                             fVar7 / fVar11,1.0,((1.0 - fVar7) - fVar11) / fVar11,fVar13 / fVar12,
                             1.0,((1.0 - fVar13) - fVar12) / fVar12);
    if (uVar1 != 0) {
      return 1;
    }
    *whitepoint = wX;
    whitepoint[1] = 1.0;
  }
  else {
    if (icc->inputspace != 2) {
      m[8] = 1.0;
      auVar5._0_12_ = ZEXT812(0x3f800000);
      auVar5._12_4_ = 0;
      *(undefined1 (*) [16])(m + 4) = auVar5;
      *(undefined1 (*) [16])m = auVar5;
      whitepoint[2] = 1.0;
      whitepoint[0] = 1.0;
      whitepoint[1] = 1.0;
      return 0;
    }
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    local_78[6] = 0.0;
    local_78[7] = 0.0;
    local_78[0] = 1.0;
    local_78[1] = 0.0;
    local_78[4] = 1.0;
    local_78[5] = 0.0;
    local_78[8] = 1.0;
    if (icc->has_chad == 0) {
      getAdaptationMatrix(local_78,(int)whitepoint,icc->illuminant[0],icc->illuminant[1],
                          icc->illuminant[2],icc->white[0],icc->white[1],icc->white[2]);
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        white[lVar3] = icc->white[lVar3];
      }
    }
    else {
      for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
        local_78[lVar3] = icc->chad[lVar3];
      }
      invMatrix(local_78);
      mulMatrix(white,white + 1,white + 2,local_78,(double)icc->white[0],(double)icc->white[1],
                (double)icc->white[2]);
    }
    mulMatrix(red,red + 1,red + 2,local_78,(double)icc->red[0],(double)icc->red[1],
              (double)icc->red[2]);
    mulMatrix(green,green + 1,green + 2,local_78,(double)icc->green[0],(double)icc->green[1],
              (double)icc->green[2]);
    mulMatrix(blue,blue + 1,blue + 2,local_78,(double)icc->blue[0],(double)icc->blue[1],
              (double)icc->blue[2]);
    local_9c = white[2];
    uVar1 = getChrmMatrixXYZ(m,(float)white._0_8_,SUB84(white._0_8_,4),white[2],red[0],red[1],red[2]
                             ,green[0],green[1],green[2],blue[0],blue[1],blue[2]);
    if (uVar1 != 0) {
      return 1;
    }
    *(undefined8 *)whitepoint = white._0_8_;
  }
  whitepoint[2] = local_9c;
  return 0;
}

Assistant:

static unsigned getChrm(float m[9], float whitepoint[3], unsigned use_icc,
                        const LodePNGICC* icc, const LodePNGInfo* info) {
  size_t i;
  if(use_icc) {
    if(getICCChrm(m, whitepoint, icc)) return 1;  /* error in the matrix computations */
  } else if(info->chrm_defined && !info->srgb_defined) {
    float wx = info->chrm_white_x / 100000.0f, wy = info->chrm_white_y / 100000.0f;
    float rx = info->chrm_red_x / 100000.0f, ry = info->chrm_red_y / 100000.0f;
    float gx = info->chrm_green_x / 100000.0f, gy = info->chrm_green_y / 100000.0f;
    float bx = info->chrm_blue_x / 100000.0f, by = info->chrm_blue_y / 100000.0f;
    if(getChrmMatrixXY(m, wx, wy, rx, ry, gx, gy, bx, by)) return 1; /* returns if error */
    /* Output whitepoint, xyY to XYZ: */
    whitepoint[0] = wx / wy;
    whitepoint[1] = 1;
    whitepoint[2] = (1 - wx - wy) / wy;
  } else {
    /* the standard linear sRGB to XYZ matrix */
    static const float srgb[9] = {
        0.4124564f, 0.3575761f, 0.1804375f,
        0.2126729f, 0.7151522f, 0.0721750f,
        0.0193339f, 0.1191920f, 0.9503041f
    };
    for(i = 0; i < 9; i++) m[i] = srgb[i];
    /* sRGB's whitepoint xyY "0.3127,0.3290,1" in XYZ: */
    whitepoint[0] = 0.9504559270516716f;
    whitepoint[1] = 1;
    whitepoint[2] = 1.0890577507598784f;
  }
  return 0;
}